

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

PolicyStatus statusForTarget(cmGeneratorTarget *tgt,char *policy)

{
  int iVar1;
  char *policy_local;
  cmGeneratorTarget *tgt_local;
  
  iVar1 = strcmp(policy,"CMP0003");
  if (iVar1 == 0) {
    tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0003(tgt);
  }
  else {
    iVar1 = strcmp(policy,"CMP0004");
    if (iVar1 == 0) {
      tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0004(tgt);
    }
    else {
      iVar1 = strcmp(policy,"CMP0008");
      if (iVar1 == 0) {
        tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0008(tgt);
      }
      else {
        iVar1 = strcmp(policy,"CMP0020");
        if (iVar1 == 0) {
          tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0020(tgt);
        }
        else {
          iVar1 = strcmp(policy,"CMP0021");
          if (iVar1 == 0) {
            tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          }
          else {
            iVar1 = strcmp(policy,"CMP0022");
            if (iVar1 == 0) {
              tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0022(tgt);
            }
            else {
              iVar1 = strcmp(policy,"CMP0027");
              if (iVar1 == 0) {
                tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
              }
              else {
                iVar1 = strcmp(policy,"CMP0037");
                if (iVar1 == 0) {
                  tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0037(tgt);
                }
                else {
                  iVar1 = strcmp(policy,"CMP0038");
                  if (iVar1 == 0) {
                    tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0038(tgt);
                  }
                  else {
                    iVar1 = strcmp(policy,"CMP0041");
                    if (iVar1 == 0) {
                      tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0041(tgt);
                    }
                    else {
                      iVar1 = strcmp(policy,"CMP0042");
                      if (iVar1 == 0) {
                        tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0042(tgt);
                      }
                      else {
                        iVar1 = strcmp(policy,"CMP0046");
                        if (iVar1 == 0) {
                          tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0046(tgt);
                        }
                        else {
                          iVar1 = strcmp(policy,"CMP0052");
                          if (iVar1 == 0) {
                            tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0052(tgt);
                          }
                          else {
                            iVar1 = strcmp(policy,"CMP0060");
                            if (iVar1 == 0) {
                              tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0060(tgt);
                            }
                            else {
                              iVar1 = strcmp(policy,"CMP0063");
                              if (iVar1 == 0) {
                                tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0063(tgt);
                              }
                              else {
                                iVar1 = strcmp(policy,"CMP0065");
                                if (iVar1 == 0) {
                                  tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0065(tgt);
                                }
                                else {
                                  iVar1 = strcmp(policy,"CMP0068");
                                  if (iVar1 == 0) {
                                    tgt_local._4_4_ = cmGeneratorTarget::GetPolicyStatusCMP0068(tgt)
                                    ;
                                  }
                                  else {
                                    iVar1 = strcmp(policy,"CMP0069");
                                    if (iVar1 == 0) {
                                      tgt_local._4_4_ =
                                           cmGeneratorTarget::GetPolicyStatusCMP0069(tgt);
                                    }
                                    else {
                                      iVar1 = strcmp(policy,"CMP0073");
                                      if (iVar1 == 0) {
                                        tgt_local._4_4_ =
                                             cmGeneratorTarget::GetPolicyStatusCMP0073(tgt);
                                      }
                                      else {
                                        iVar1 = strcmp(policy,"CMP0076");
                                        if (iVar1 == 0) {
                                          tgt_local._4_4_ =
                                               cmGeneratorTarget::GetPolicyStatusCMP0076(tgt);
                                        }
                                        else {
                                          iVar1 = strcmp(policy,"CMP0081");
                                          if (iVar1 == 0) {
                                            tgt_local._4_4_ =
                                                 cmGeneratorTarget::GetPolicyStatusCMP0081(tgt);
                                          }
                                          else {
                                            iVar1 = strcmp(policy,"CMP0083");
                                            if (iVar1 != 0) {
                                              __assert_fail(
                                                  "false && \"Unreachable code. Not a valid policy\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                                  ,0x6a1,
                                                  "cmPolicies::PolicyStatus statusForTarget(const cmGeneratorTarget *, const char *)"
                                                  );
                                            }
                                            tgt_local._4_4_ =
                                                 cmGeneratorTarget::GetPolicyStatusCMP0083(tgt);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tgt_local._4_4_;
}

Assistant:

cmPolicies::PolicyStatus statusForTarget(cmGeneratorTarget const* tgt,
                                         const char* policy)
{
#define RETURN_POLICY(POLICY)                                                 \
  if (strcmp(policy, #POLICY) == 0) {                                         \
    return tgt->GetPolicyStatus##POLICY();                                    \
  }

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY)

#undef RETURN_POLICY

  assert(false && "Unreachable code. Not a valid policy");
  return cmPolicies::WARN;
}